

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkgtypes.c
# Opt level: O0

char * pkg_writeCharList(FileStream *s,CharList *l,char *delim,int32_t quote)

{
  size_t sVar1;
  undefined8 local_430;
  char local_428;
  char acStack_427 [7];
  char buffer [1024];
  int32_t quote_local;
  char *delim_local;
  CharList *l_local;
  FileStream *s_local;
  
  buffer._1020_4_ = quote;
  delim_local = (char *)l;
  do {
    if (delim_local == (char *)0x0) {
      return (char *)0x0;
    }
    if (*(long *)delim_local != 0) {
      strncpy(&local_428,*(char **)delim_local,0x3ff);
      buffer[0x3f7] = '\0';
      sVar1 = strlen(*(char **)delim_local);
      if (0x3fe < sVar1) {
        fprintf(_stderr,"%s:%d: Internal error, line too long (greater than 1023 chars)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hunter-packages[P]icu/source/tools/pkgdata/pkgtypes.c"
                ,0x57);
        exit(0);
      }
      if ((int)buffer._1020_4_ < 0) {
        sVar1 = strlen(&local_428);
        if (*(char *)((long)&local_430 + sVar1 + 7) == '\"') {
          sVar1 = strlen(&local_428);
          *(undefined1 *)((long)&local_430 + sVar1 + 7) = 0;
        }
        if (local_428 == '\"') {
          strcpy(&local_428,acStack_427);
        }
      }
      else if (0 < (int)buffer._1020_4_) {
        if (**(char **)delim_local != '\"') {
          strcpy(&local_428,"\"");
          strcat(&local_428,*(char **)delim_local);
        }
        local_430 = *(long *)delim_local;
        sVar1 = strlen(*(char **)delim_local);
        if (*(char *)(local_430 + (sVar1 - 1)) != '\"') {
          strcat(&local_428,"\"");
        }
      }
      sVar1 = strlen(&local_428);
      T_FileStream_write(s,&local_428,(int32_t)sVar1);
    }
    if ((*(long *)(delim_local + 8) != 0) && (delim != (char *)0x0)) {
      sVar1 = strlen(delim);
      T_FileStream_write(s,delim,(int32_t)sVar1);
    }
    delim_local = *(char **)(delim_local + 8);
  } while( true );
}

Assistant:

const char *pkg_writeCharList(FileStream *s, CharList *l, const char *delim, int32_t quote)
{
    char buffer[1024];
    while(l != NULL)
    {
        if(l->str)
        {
            uprv_strncpy(buffer, l->str, 1023);
            buffer[1023]=0;
            if(uprv_strlen(l->str) >= 1023)
            {
                fprintf(stderr, "%s:%d: Internal error, line too long (greater than 1023 chars)\n",
                        __FILE__, __LINE__);
                exit(0);
            }
            if(quote < 0) { /* remove quotes */
                if(buffer[uprv_strlen(buffer)-1] == '"') {
                    buffer[uprv_strlen(buffer)-1] = '\0';
                }
                if(buffer[0] == '"') {
                    uprv_strcpy(buffer, buffer+1);
                }
            } else if(quote > 0) { /* add quotes */
                if(l->str[0] != '"') {
                    uprv_strcpy(buffer, "\"");
                    uprv_strcat(buffer, l->str);
                }
                if(l->str[uprv_strlen(l->str)-1] != '"') {
                    uprv_strcat(buffer, "\"");
                }
            }
            T_FileStream_write(s, buffer, (int32_t)uprv_strlen(buffer));
        }

        if(l->next && delim)
        {
            T_FileStream_write(s, delim, (int32_t)uprv_strlen(delim));
        }
        l = l->next;
    }
    return NULL;
}